

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O0

Status __thiscall leveldb::Footer::DecodeFrom(Footer *this,Slice *input)

{
  long lVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  Slice *this_00;
  undefined8 *in_RDX;
  char *in_RDI;
  long in_FS_OFFSET;
  char *end;
  uint64_t magic;
  uint32_t magic_hi;
  uint32_t magic_lo;
  char *magic_ptr;
  Status *result;
  Slice *in_stack_ffffffffffffff28;
  Slice *in_stack_ffffffffffffff30;
  Slice *in_stack_ffffffffffffff38;
  BlockHandle *in_stack_ffffffffffffff40;
  undefined8 local_40;
  undefined8 local_38;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Slice::data(in_stack_ffffffffffffff28);
  uVar3 = DecodeFixed32((char *)in_stack_ffffffffffffff30);
  uVar4 = DecodeFixed32((char *)in_stack_ffffffffffffff30);
  if (CONCAT44(uVar4,uVar3) == -0x24b88adb747f04a9) {
    BlockHandle::DecodeFrom(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    bVar2 = Status::ok((Status *)in_stack_ffffffffffffff28);
    if (bVar2) {
      BlockHandle::DecodeFrom(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      Status::operator=((Status *)in_stack_ffffffffffffff38,(Status *)in_stack_ffffffffffffff30);
      Status::~Status((Status *)in_stack_ffffffffffffff28);
    }
    bVar2 = Status::ok((Status *)in_stack_ffffffffffffff28);
    if (bVar2) {
      Slice::data(in_stack_ffffffffffffff28);
      this_00 = (Slice *)Slice::size(in_stack_ffffffffffffff28);
      Slice::Slice(this_00,(char *)in_stack_ffffffffffffff30,(size_t)in_stack_ffffffffffffff28);
      *in_RDX = local_40;
      in_RDX[1] = local_38;
    }
  }
  else {
    Slice::Slice(in_stack_ffffffffffffff38,(char *)in_stack_ffffffffffffff30);
    Slice::Slice(in_stack_ffffffffffffff28);
    Status::Corruption(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (Status)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

Status Footer::DecodeFrom(Slice* input) {
  const char* magic_ptr = input->data() + kEncodedLength - 8;
  const uint32_t magic_lo = DecodeFixed32(magic_ptr);
  const uint32_t magic_hi = DecodeFixed32(magic_ptr + 4);
  const uint64_t magic = ((static_cast<uint64_t>(magic_hi) << 32) |
                          (static_cast<uint64_t>(magic_lo)));
  if (magic != kTableMagicNumber) {
    return Status::Corruption("not an sstable (bad magic number)");
  }

  Status result = metaindex_handle_.DecodeFrom(input);
  if (result.ok()) {
    result = index_handle_.DecodeFrom(input);
  }
  if (result.ok()) {
    // We skip over any leftover data (just padding for now) in "input"
    const char* end = magic_ptr + 8;
    *input = Slice(end, input->data() + input->size() - end);
  }
  return result;
}